

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImathMatrixAlgo.h
# Opt level: O0

void Imath_3_2::extractEuler<float>(Matrix33<float> *mat,float *rot)

{
  float a;
  float *pfVar1;
  uint *in_RSI;
  Matrix33<float> *in_RDI;
  double dVar2;
  Vec2<float> j;
  Vec2<float> i;
  undefined4 in_stack_ffffffffffffffd0;
  float fVar3;
  Vec2<float> local_20;
  Vec2<float> local_18;
  uint *local_10;
  Matrix33<float> *local_8;
  
  local_10 = in_RSI;
  local_8 = in_RDI;
  pfVar1 = Matrix33<float>::operator[](in_RDI,0);
  fVar3 = *pfVar1;
  pfVar1 = Matrix33<float>::operator[](local_8,0);
  Vec2<float>::Vec2(&local_18,fVar3,pfVar1[1]);
  pfVar1 = Matrix33<float>::operator[](local_8,1);
  a = *pfVar1;
  pfVar1 = Matrix33<float>::operator[](local_8,1);
  Vec2<float>::Vec2(&local_20,a,pfVar1[1]);
  Vec2<float>::normalize((Vec2<float> *)CONCAT44(fVar3,in_stack_ffffffffffffffd0));
  Vec2<float>::normalize((Vec2<float> *)CONCAT44(fVar3,in_stack_ffffffffffffffd0));
  pfVar1 = Vec2<float>::operator[](&local_20,0);
  fVar3 = *pfVar1;
  pfVar1 = Vec2<float>::operator[](&local_18,0);
  dVar2 = std::atan2((double)(ulong)(uint)fVar3,(double)(ulong)(uint)*pfVar1);
  *local_10 = SUB84(dVar2,0) ^ 0x80000000;
  return;
}

Assistant:

void
extractEuler (const Matrix33<T>& mat, T& rot)
{
    //
    // Normalize the local x and y axes to remove scaling.
    //

    Vec2<T> i (mat[0][0], mat[0][1]);
    Vec2<T> j (mat[1][0], mat[1][1]);

    i.normalize ();
    j.normalize ();

    //
    // Extract the angle, rot.
    //

    rot = -std::atan2 (j[0], i[0]);
}